

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

float ma_spatializer_get_doppler_factor(ma_spatializer *pSpatializer)

{
  if (pSpatializer != (ma_spatializer *)0x0) {
    return pSpatializer->dopplerFactor;
  }
  return 1.0;
}

Assistant:

MA_API float ma_spatializer_get_doppler_factor(const ma_spatializer* pSpatializer)
{
    if (pSpatializer == NULL) {
        return 1;
    }

    return ma_atomic_load_f32(&pSpatializer->dopplerFactor);
}